

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailure.cpp
# Opt level: O0

void __thiscall
MockCallOrderFailure::MockCallOrderFailure
          (MockCallOrderFailure *this,UtestShell *test,MockExpectedCallsList *expectations)

{
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  MockExpectedCallsList expectationsForOutOfOrder;
  MockExpectedCallsList *expectations_local;
  UtestShell *test_local;
  MockCallOrderFailure *this_local;
  
  expectationsForOutOfOrder.head_ = (MockExpectedCallsListNode *)expectations;
  MockFailure::MockFailure(&this->super_MockFailure,test);
  (this->super_MockFailure).super_TestFailure._vptr_TestFailure =
       (_func_int **)&PTR__MockCallOrderFailure_00366608;
  MockExpectedCallsList::MockExpectedCallsList((MockExpectedCallsList *)local_30);
  MockExpectedCallsList::addExpectations
            ((MockExpectedCallsList *)local_30,
             (MockExpectedCallsList *)expectationsForOutOfOrder.head_);
  MockExpectedCallsList::onlyKeepOutOfOrderExpectations((MockExpectedCallsList *)local_30);
  SimpleString::SimpleString(local_50,"Mock Failure: Out of order calls");
  SimpleString::operator=(&(this->super_MockFailure).super_TestFailure.message_,local_50);
  SimpleString::~SimpleString(local_50);
  SimpleString::operator+=(&(this->super_MockFailure).super_TestFailure.message_,"\n");
  MockFailure::addExpectationsAndCallHistory
            (&this->super_MockFailure,(MockExpectedCallsList *)local_30);
  MockExpectedCallsList::~MockExpectedCallsList((MockExpectedCallsList *)local_30);
  return;
}

Assistant:

MockCallOrderFailure::MockCallOrderFailure(UtestShell* test, const MockExpectedCallsList& expectations) : MockFailure(test)
{
    MockExpectedCallsList expectationsForOutOfOrder;
    expectationsForOutOfOrder.addExpectations(expectations);
    expectationsForOutOfOrder.onlyKeepOutOfOrderExpectations();

    message_ = "Mock Failure: Out of order calls";
    message_ += "\n";
    addExpectationsAndCallHistory(expectationsForOutOfOrder);
}